

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

nghttp2_hd_entry *
hd_map_find(nghttp2_hd_map *map,int *exact_match,nghttp2_nv *nv,int32_t token,uint32_t hash,
           int name_only)

{
  int iVar1;
  nghttp2_hd_entry *local_40;
  nghttp2_hd_entry *res;
  nghttp2_hd_entry *p;
  int name_only_local;
  uint32_t hash_local;
  int32_t token_local;
  nghttp2_nv *nv_local;
  int *exact_match_local;
  nghttp2_hd_map *map_local;
  
  local_40 = (nghttp2_hd_entry *)0x0;
  *exact_match = 0;
  res = map->table[hash & 0x7f];
  do {
    if (res == (nghttp2_hd_entry *)0x0) {
      return local_40;
    }
    if ((token == (res->nv).token) &&
       ((token != -1 || ((hash == res->hash && (iVar1 = name_eq(&res->nv,nv), iVar1 != 0)))))) {
      if ((local_40 == (nghttp2_hd_entry *)0x0) && (local_40 = res, name_only != 0)) {
        return res;
      }
      iVar1 = value_eq(&res->nv,nv);
      if (iVar1 != 0) {
        *exact_match = 1;
        return res;
      }
    }
    res = res->next;
  } while( true );
}

Assistant:

static nghttp2_hd_entry *hd_map_find(nghttp2_hd_map *map, int *exact_match,
                                     const nghttp2_nv *nv, int32_t token,
                                     uint32_t hash, int name_only) {
  nghttp2_hd_entry *p;
  nghttp2_hd_entry *res = NULL;

  *exact_match = 0;

  for (p = map->table[hash & (HD_MAP_SIZE - 1)]; p; p = p->next) {
    if (token != p->nv.token ||
        (token == -1 && (hash != p->hash || !name_eq(&p->nv, nv)))) {
      continue;
    }
    if (!res) {
      res = p;
      if (name_only) {
        break;
      }
    }
    if (value_eq(&p->nv, nv)) {
      res = p;
      *exact_match = 1;
      break;
    }
  }

  return res;
}